

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.hpp
# Opt level: O1

void __thiscall nivalis::Environment::Environment(Environment *this,Environment *other)

{
  pointer pcVar1;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->vars,&other->vars);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->varname,&other->varname);
  std::
  vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>::
  vector(&this->funcs,&other->funcs);
  (this->error_msg)._M_dataplus._M_p = (pointer)&(this->error_msg).field_2;
  pcVar1 = (other->error_msg)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->error_msg,pcVar1,pcVar1 + (other->error_msg)._M_string_length);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->free_addrs,&other->free_addrs);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::_Rb_tree(&(this->vreg)._M_t,&(other->vreg)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::_Rb_tree(&(this->freg)._M_t,&(other->freg)._M_t);
  return;
}

Assistant:

Environment(const Environment& other) =default;